

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase139::run(TestCase139 *this)

{
  bool bVar1;
  anon_class_8_1_a7a66179 *extraout_RDX;
  anon_class_8_1_a7a66179 *extraout_RDX_00;
  anon_class_8_1_a7a66179 *func;
  anon_class_8_1_a7a66179 *extraout_RDX_01;
  int local_5a0;
  bool local_599;
  int local_598;
  DebugExpression<int> DStack_594;
  bool _kj_shouldLog_2;
  undefined1 local_590 [8];
  DebugComparison<int,_int_&> _kjCondition_2;
  bool *pbStack_560;
  bool _kj_shouldLog_1;
  Maybe<kj::Exception> local_558;
  DebugExpression<kj::Maybe<kj::Exception>_> local_3c0;
  undefined1 local_228 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_1;
  bool local_65;
  bool _kj_shouldLog;
  int local_58;
  DebugExpression<int> local_54;
  undefined1 local_50 [8];
  DebugComparison<int,_int_&> _kjCondition;
  Array<kj::(anonymous_namespace)::TestObject> array;
  TestCase139 *this_local;
  
  kj::(anonymous_namespace)::TestObject::count = 0;
  kj::(anonymous_namespace)::TestObject::throwAt = 0xffffffff;
  heapArray<kj::(anonymous_namespace)::TestObject>
            ((Array<kj::(anonymous_namespace)::TestObject> *)&_kjCondition.result,0x20);
  local_58 = 0x20;
  local_54 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_58);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_50,&local_54,
             &kj::(anonymous_namespace)::TestObject::count);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
  func = extraout_RDX;
  if (!bVar1) {
    local_65 = kj::_::Debug::shouldLog(ERROR);
    func = extraout_RDX_00;
    while (local_65 != false) {
      _kjCondition_1._436_4_ = 0x20;
      kj::_::Debug::log<char_const(&)[45],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x90,ERROR,
                 "\"failed: expected \" \"(32) == (TestObject::count)\", _kjCondition, 32, TestObject::count"
                 ,(char (*) [45])"failed: expected (32) == (TestObject::count)",
                 (DebugComparison<int,_int_&> *)local_50,(int *)&_kjCondition_1.field_0x1b4,
                 &kj::(anonymous_namespace)::TestObject::count);
      func = extraout_RDX_01;
      local_65 = false;
    }
  }
  kj::(anonymous_namespace)::TestObject::throwAt = 0x10;
  pbStack_560 = &_kjCondition.result;
  runCatchingExceptions<kj::(anonymous_namespace)::TestCase139::run()::__0>
            (&local_558,(kj *)&stack0xfffffffffffffaa0,func);
  kj::_::DebugExpressionStart::operator<<
            (&local_3c0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_558);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_228,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_3c0,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_3c0);
  Maybe<kj::Exception>::~Maybe(&local_558);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_228);
  if (!bVar1) {
    _kjCondition_2._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_2._39_1_ != '\0') {
      kj::_::Debug::
      log<char_const(&)[85],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x94,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { array = nullptr; }) != kj::none\", _kjCondition"
                 ,(char (*) [85])
                  "failed: expected ::kj::runCatchingExceptions([&]() { array = nullptr; }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_228);
      _kjCondition_2._39_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_228);
  local_598 = 0;
  DStack_594 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_598);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_590,&stack0xfffffffffffffa6c,
             &kj::(anonymous_namespace)::TestObject::count);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_590);
  if (!bVar1) {
    local_599 = kj::_::Debug::shouldLog(ERROR);
    while (local_599 != false) {
      local_5a0 = 0;
      kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
                 ,0x95,ERROR,
                 "\"failed: expected \" \"(0) == (TestObject::count)\", _kjCondition, 0, TestObject::count"
                 ,(char (*) [44])"failed: expected (0) == (TestObject::count)",
                 (DebugComparison<int,_int_&> *)local_590,&local_5a0,
                 &kj::(anonymous_namespace)::TestObject::count);
      local_599 = false;
    }
  }
  Array<kj::(anonymous_namespace)::TestObject>::~Array
            ((Array<kj::(anonymous_namespace)::TestObject> *)&_kjCondition.result);
  return;
}

Assistant:

TEST(Array, ThrowingDestructor) {
  TestObject::count = 0;
  TestObject::throwAt = -1;

  Array<TestObject> array = heapArray<TestObject>(32);
  EXPECT_EQ(32, TestObject::count);

  // If a destructor throws, all elements should still be destroyed.
  TestObject::throwAt = 16;
  EXPECT_ANY_THROW(array = nullptr);
  EXPECT_EQ(0, TestObject::count);
}